

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbidata.cpp
# Opt level: O1

void __thiscall icu_63::RBBIDataWrapper::init0(RBBIDataWrapper *this)

{
  this->fTrie = (UTrie2 *)0x0;
  this->fUDataMem = (UDataMemory *)0x0;
  this->fHeader = (RBBIDataHeader *)0x0;
  this->fForwardTable = (RBBIStateTable *)0x0;
  this->fReverseTable = (RBBIStateTable *)0x0;
  this->fRuleSource = (UChar *)0x0;
  this->fRuleStatusTable = (int32_t *)0x0;
  LOCK();
  (this->fRefCount).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  this->fDontFreeData = '\x01';
  return;
}

Assistant:

void RBBIDataWrapper::init0() {
    fHeader = NULL;
    fForwardTable = NULL;
    fReverseTable = NULL;
    fRuleSource   = NULL;
    fRuleStatusTable = NULL;
    fTrie         = NULL;
    fUDataMem     = NULL;
    fRefCount     = 0;
    fDontFreeData = TRUE;
}